

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O3

ion_err_t dictionary_open(ion_dictionary_handler_t *handler,ion_dictionary_t *dictionary,
                         ion_dictionary_config_info_t *config)

{
  int iVar1;
  int iVar2;
  ion_dictionary_id_t iVar3;
  ion_key_type_t iVar4;
  ion_dictionary_size_t iVar5;
  _func_ion_err_t_ion_dictionary_id_t_ion_key_type_t_ion_key_size_t_ion_value_size_t_ion_dictionary_size_t_ion_dictionary_compare_t_ion_dictionary_handler_t_ptr_ion_dictionary_t_ptr
  *p_Var6;
  _func_ion_status_t_ion_dictionary_t_ptr_ion_key_t_ion_value_t *p_Var7;
  _func_ion_err_t_ion_dictionary_t_ptr *p_Var8;
  ion_dictionary_compare_t p_Var9;
  ion_dictionary_handler_t *piVar10;
  ion_key_t pvVar11;
  ion_err_t iVar12;
  char cVar13;
  uint uVar14;
  ion_key_t pvVar15;
  ion_status_t iVar16;
  ion_key_size_t extraout_EDX;
  ion_dictionary_handler_t **ppiVar17;
  code *pcVar18;
  undefined8 auStack_110 [3];
  undefined1 auStack_f8 [16];
  ion_dictionary_handler_t fallback_handler;
  undefined1 local_80 [8];
  ion_predicate_t predicate;
  ion_dictionary_t fallback_dict;
  ion_record_t record;
  ion_dict_cursor_t *cursor;
  
  uVar14 = config->type - key_type_numeric_unsigned;
  if (uVar14 < 3) {
    pcVar18 = (code *)(&PTR_dictionary_compare_unsigned_value_00113dd8)[uVar14];
  }
  else {
    pcVar18 = dictionary_compare_signed_value;
  }
  auStack_110[2] = 0x105ca1;
  iVar12 = (*handler->open_dictionary)(handler,dictionary,config,pcVar18);
  if (iVar12 == '\0') {
LAB_00105e37:
    dictionary->status = '\0';
    dictionary->instance->id = config->id;
    return '\0';
  }
  if (iVar12 == '\x0f') {
    record.value = (ion_value_t)0x0;
    auStack_110[2] = 0x105ccf;
    ffdict_init((ion_dictionary_handler_t *)(auStack_f8 + 8));
    fallback_handler.close_dictionary._0_4_ = config->id;
    fallback_handler.close_dictionary._4_1_ = 0;
    auStack_110[2] = 0x105d06;
    iVar12 = dictionary_open((ion_dictionary_handler_t *)(auStack_f8 + 8),
                             (ion_dictionary_t *)&predicate.destroy,
                             (ion_dictionary_config_info_t *)&fallback_handler.close_dictionary);
    if (iVar12 != '\0') {
      return iVar12;
    }
    auStack_110[2] = 0x105d1d;
    dictionary_build_predicate((ion_predicate_t *)local_80,'\x02');
    auStack_110[2] = 0x105d2f;
    cVar13 = (**(code **)(fallback_dict.instance + 1))
                       (&predicate.destroy,(ion_predicate_t *)local_80,&record.value);
    if (cVar13 != '\0') {
      return cVar13;
    }
    iVar1 = config->key_size;
    fallback_dict.handler =
         (ion_dictionary_handler_t *)(auStack_f8 + -((long)iVar1 + 0xfU & 0xfffffffffffffff0));
    iVar2 = config->value_size;
    pvVar15 = (ion_key_t)
              ((long)(auStack_f8 + -((long)iVar1 + 0xfU & 0xfffffffffffffff0)) -
              ((long)iVar2 + 0xfU & 0xfffffffffffffff0));
    record.key = pvVar15;
    iVar3 = config->id;
    iVar4 = config->type;
    iVar5 = config->dictionary_size;
    uVar14 = iVar4 - key_type_numeric_unsigned;
    if (uVar14 < 3) {
      pcVar18 = (code *)(&PTR_dictionary_compare_unsigned_value_00113dd8)[uVar14];
    }
    else {
      pcVar18 = dictionary_compare_signed_value;
    }
    *(ion_dictionary_t **)((long)pvVar15 + -8) = dictionary;
    *(ion_dictionary_handler_t **)((long)pvVar15 + -0x10) = handler;
    p_Var6 = handler->create_dictionary;
    *(undefined8 *)((long)pvVar15 + -0x18) = 0x105da6;
    iVar12 = (*p_Var6)(iVar3,iVar4,iVar1,iVar2,iVar5,pcVar18,
                       *(ion_dictionary_handler_t **)((long)pvVar15 + -0x10),
                       *(ion_dictionary_t **)((long)pvVar15 + -8));
    if (iVar12 == '\0') {
      dictionary->instance->id = iVar3;
      dictionary->status = '\0';
      while( true ) {
        pcVar18 = *(code **)((long)record.value + 0x18);
        *(undefined8 *)((long)pvVar15 + -8) = 0x105dd2;
        ppiVar17 = &fallback_dict.handler;
        cVar13 = (*pcVar18)();
        pvVar11 = record.key;
        piVar10 = fallback_dict.handler;
        if ((cVar13 != '\x02') && (cVar13 != '\x04')) break;
        p_Var7 = dictionary->handler->insert;
        *(undefined8 *)((long)pvVar15 + -8) = 0x105def;
        iVar16 = (*p_Var7)(dictionary,piVar10,pvVar11);
        if (iVar16.error != '\0') {
          pcVar18 = *(code **)((long)record.value + 0x20);
          *(undefined8 *)((long)pvVar15 + -8) = 0x105e01;
          (*pcVar18)();
          *(undefined8 *)((long)pvVar15 + -8) = 0x105e0a;
          dictionary_close((ion_dictionary_t *)&predicate.destroy);
          p_Var8 = dictionary->handler->delete_dictionary;
          *(undefined8 *)((long)pvVar15 + -8) = 0x105e14;
          (*p_Var8)(dictionary);
          return iVar16.error;
        }
      }
      if (cVar13 != '\x01') {
        return '\x12';
      }
      pcVar18 = *(code **)((long)record.value + 0x20);
      *(undefined8 *)((long)pvVar15 + -8) = 0x105e25;
      (*pcVar18)();
      p_Var9 = fallback_dict.instance[1].compare;
      *(undefined8 *)((long)pvVar15 + -8) = 0x105e30;
      cVar13 = (*p_Var9)(&predicate.destroy,ppiVar17,extraout_EDX);
      if (cVar13 != '\0') {
        return cVar13;
      }
      goto LAB_00105e37;
    }
  }
  dictionary->status = '\x02';
  return iVar12;
}

Assistant:

ion_err_t
dictionary_open(
	ion_dictionary_handler_t		*handler,
	ion_dictionary_t				*dictionary,
	ion_dictionary_config_info_t	*config
) {
	ion_dictionary_compare_t compare	= dictionary_switch_compare(config->type);

	ion_err_t error						= handler->open_dictionary(handler, dictionary, config, compare);

	if (err_not_implemented == error) {
		ion_predicate_t				predicate;
		ion_dict_cursor_t			*cursor = NULL;
		ion_record_t				record;
		ion_dictionary_handler_t	fallback_handler;
		ion_dictionary_t			fallback_dict;
		ion_err_t					err;

		ffdict_init(&fallback_handler);

		ion_dictionary_config_info_t fallback_config = {
			config->id, 0, config->type, config->key_size, config->value_size, 1
		};

		err = dictionary_open(&fallback_handler, &fallback_dict, &fallback_config);

		if (err_ok != err) {
			return err;
		}

		dictionary_build_predicate(&predicate, predicate_all_records);
		err = dictionary_find(&fallback_dict, &predicate, &cursor);

		if (err_ok != err) {
			return err;
		}

		record.key		= alloca(config->key_size);
		record.value	= alloca(config->value_size);

		err				= dictionary_create(handler, dictionary, config->id, config->type, config->key_size, config->value_size, config->dictionary_size);

		if (err_ok != err) {
			return err;
		}

		ion_cursor_status_t cursor_status;

		while (cs_cursor_active == (cursor_status = cursor->next(cursor, &record)) || cs_cursor_initialized == cursor_status) {
			ion_status_t status = dictionary_insert(dictionary, record.key, record.value);

			if (err_ok != status.error) {
				cursor->destroy(&cursor);
				dictionary_close(&fallback_dict);
				dictionary_delete_dictionary(dictionary);
				return status.error;
			}
		}

		if (cursor_status != cs_end_of_results) {
			return err_uninitialized;
		}

		cursor->destroy(&cursor);

		err = dictionary_delete_dictionary(&fallback_dict);

		if (err_ok != err) {
			return err;
		}

		error = err_ok;
	}

	if (err_ok == error) {
		dictionary->status			= ion_dictionary_status_ok;
		dictionary->instance->id	= config->id;
	}
	else {
		dictionary->status = ion_dictionary_status_error;
	}

	return error;
}